

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O2

void __thiscall
webfront::http::std::experimental::net::v1::detail::posix_event::
unlock_and_signal_one<std::experimental::net::v1::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  ulong uVar1;
  
  uVar1 = this->state_;
  this->state_ = uVar1 | 1;
  conditionally_enabled_mutex::scoped_lock::unlock(lock);
  if (1 < uVar1) {
    pthread_cond_signal((pthread_cond_t *)this);
    return;
  }
  return;
}

Assistant:

void unlock_and_signal_one(Lock& lock)
  {
    NET_TS_ASSERT(lock.locked());
    state_ |= 1;
    bool have_waiters = (state_ > 1);
    lock.unlock();
    if (have_waiters)
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
  }